

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void set_advisor_read_lock(char *filename)

{
  int iVar1;
  FILE *__stream;
  uint *puVar2;
  char *pcVar3;
  bool bVar4;
  uint local_1c;
  int res;
  int error;
  FILE *lockfile;
  char *filename_local;
  
  local_1c = 0;
  do {
    __stream = fopen64(filename,"wb");
    bVar4 = false;
    if (__stream == (FILE *)0x0) {
      puVar2 = (uint *)__errno_location();
      local_1c = *puVar2;
      bVar4 = local_1c == 4;
    }
  } while (bVar4);
  if (__stream == (FILE *)0x0) {
    pcVar3 = strerror(local_1c);
    logmsg("Error creating lock file %s error: %d %s",filename,(ulong)local_1c,pcVar3);
  }
  else {
    do {
      iVar1 = fclose(__stream);
      bVar4 = false;
      if (iVar1 != 0) {
        puVar2 = (uint *)__errno_location();
        local_1c = *puVar2;
        bVar4 = local_1c == 4;
      }
    } while (bVar4);
    if (iVar1 != 0) {
      pcVar3 = strerror(local_1c);
      logmsg("Error closing lock file %s error: %d %s",filename,(ulong)local_1c,pcVar3);
    }
  }
  return;
}

Assistant:

void set_advisor_read_lock(const char *filename)
{
  FILE *lockfile;
  int error = 0;
  int res;

  do {
    lockfile = fopen(filename, "wb");
  } while((lockfile == NULL) && ((error = errno) == EINTR));
  if(lockfile == NULL) {
    logmsg("Error creating lock file %s error: %d %s",
           filename, error, strerror(error));
    return;
  }

  do {
    res = fclose(lockfile);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing lock file %s error: %d %s",
           filename, error, strerror(error));
}